

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::GetOneofCaseName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *descriptor)

{
  bool bVar1;
  string property_name;
  allocator<char> local_31;
  string local_30;
  
  GetPropertyName_abi_cxx11_(&local_30,this,descriptor);
  bVar1 = std::operator==(&local_30,"None");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"None_",&local_31);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GetOneofCaseName(const FieldDescriptor* descriptor) {
  // The name in a oneof case enum is the same as for the property, but as we
  // always have a "None" value as well, we need to reserve that by appending an
  // underscore.
  std::string property_name = GetPropertyName(descriptor);
  return property_name == "None" ? "None_" : property_name;
}